

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComparableString.hpp
# Opt level: O1

void __thiscall
database::ComparableString::ComparableString(ComparableString *this,ComparableString *string)

{
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  (this->m_string)._M_string_length = 0;
  (this->m_string).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

ComparableString(const database::ComparableString& string) { this -> m_string = string.m_string; }